

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

void __thiscall LinearScan::Init(LinearScan *this)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  uint32 *puVar5;
  ulong uVar6;
  BVIndex index;
  BitVector *pBVar7;
  
  uVar6 = 0;
  do {
    uVar1 = uVar6 + 1;
    bVar2 = "\x01\f\f\f\n\x01\x01\x04\x04\f\f\f\f\n\n\n\n"[uVar6 + 1];
    index = (BVIndex)uVar1;
    bVar3 = (byte)uVar1;
    if ((bVar2 & 1) != 0) {
      BVUnitT<unsigned_long>::AssertRange(index);
      (this->activeRegs).word = (this->activeRegs).word | 1L << (bVar3 & 0x3f);
      bVar4 = IRType_IsFloat(RegTypes[uVar6 + 1]);
      if (bVar4) {
        this->floatRegUsedCount = this->floatRegUsedCount + 1;
      }
      else {
        this->intRegUsedCount = this->intRegUsedCount + 1;
      }
    }
    puVar5 = &this->numInt32Regs;
    pBVar7 = &this->int32Regs;
    if (uVar1 < 0x11) {
LAB_0058280b:
      BVUnitT<unsigned_long>::AssertRange(index);
      pBVar7->word = pBVar7->word | 1L << (bVar3 & 0x3f);
      *puVar5 = *puVar5 + 1;
    }
    else {
      puVar5 = &this->numFloatRegs;
      pBVar7 = &this->floatRegs;
      if (uVar6 - 0x10 < 0x10) goto LAB_0058280b;
    }
    if ((bVar2 & 3) == 0) {
      BVUnitT<unsigned_long>::AssertRange(index);
      (this->callerSavedRegs).word = (this->callerSavedRegs).word | 1L << (bVar3 & 0x3f);
    }
    if ((bVar2 & 2) != 0) {
      BVUnitT<unsigned_long>::AssertRange(index);
      (this->calleeSavedRegs).word = (this->calleeSavedRegs).word | 1L << (bVar3 & 0x3f);
    }
    this->regContent[uVar6 + 1] = (Lifetime *)0x0;
    uVar6 = uVar1;
    if (uVar1 == 0x20) {
      (this->instrUseRegs).word = 0;
      (this->secondChanceRegs).word = 0;
      (this->linearScanMD).super_LinearScanMDShared.linearScan = this;
      (this->nonAllocatableRegs).word = (this->activeRegs).word;
      this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
      this_01 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
      bVar4 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_015cd718,LinearScanPhase,sourceContextId,functionId);
      if (bVar4) {
        Func::DumpHeader(this->func);
        return;
      }
      return;
    }
  } while( true );
}

Assistant:

void
LinearScan::Init()
{
    FOREACH_REG(reg)
    {
        // Registers that can't be used are set to active, and will remain this way
        if (!LinearScan::IsAllocatable(reg))
        {
            this->activeRegs.Set(reg);
            if (IRType_IsFloat(RegTypes[reg]))
            {
                this->floatRegUsedCount++;
            }
            else
            {
                this->intRegUsedCount++;
            }
        }
        if (RegTypes[reg] == TyMachReg)
        {
            // JIT64_TODO: Rename int32Regs to machIntRegs.
            this->int32Regs.Set(reg);
            numInt32Regs++;
        }
        else if (RegTypes[reg] == TyFloat64)
        {
            this->floatRegs.Set(reg);
            numFloatRegs++;
        }
        if (LinearScan::IsCallerSaved(reg))
        {
            this->callerSavedRegs.Set(reg);
        }
        if (LinearScan::IsCalleeSaved(reg))
        {
            this->calleeSavedRegs.Set(reg);
        }
        this->regContent[reg] = nullptr;
    } NEXT_REG;

    this->instrUseRegs.ClearAll();
    this->secondChanceRegs.ClearAll();

    this->linearScanMD.Init(this);

#if DBG
    this->nonAllocatableRegs = this->activeRegs;
#endif

#if DBG_DUMP
    if (PHASE_TRACE(Js::LinearScanPhase, this->func))
    {
        this->func->DumpHeader();
    }
#endif
}